

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int parse_int(char *val_str,int64_t min,int64_t max,int base,int64_t *ret,lyd_node *node)

{
  int *piVar1;
  longlong lVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char cVar5;
  char *local_48;
  int64_t local_40;
  int64_t local_38;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x1b0,
                  "int parse_int(const char *, int64_t, int64_t, int, int64_t *, struct lyd_node *)"
                 );
  }
  if (val_str == (char *)0x0) {
    val_str = "";
  }
  else if (*val_str != '\0') {
    local_40 = min;
    local_38 = max;
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_48 = (char *)0x0;
    lVar2 = strtoll(val_str,&local_48,base);
    pcVar4 = local_48;
    *ret = lVar2;
    if (((*piVar1 == 0) && (local_40 <= lVar2)) && (lVar2 <= local_38)) {
      if (local_48 == (char *)0x0) {
        return 0;
      }
      cVar5 = *local_48;
      if (cVar5 == '\0') {
        return 0;
      }
      ppuVar3 = __ctype_b_loc();
      while (pcVar4 = pcVar4 + 1, (*(byte *)((long)*ppuVar3 + (long)cVar5 * 2 + 1) & 0x20) != 0) {
        cVar5 = *pcVar4;
      }
      if (cVar5 == '\0') {
        return 0;
      }
    }
  }
  ly_vlog(node->schema->module->ctx,LYE_INVAL,LY_VLOG_LYD,node,val_str,node->schema->name);
  return 1;
}

Assistant:

static int
parse_int(const char *val_str, int64_t min, int64_t max, int base, int64_t *ret, struct lyd_node *node)
{
    char *strptr;

    assert(node);

    if (!val_str || !val_str[0]) {
        goto error;
    }

    /* convert to 64-bit integer, all the redundant characters are handled */
    errno = 0;
    strptr = NULL;

    /* parse the value */
    *ret = strtoll(val_str, &strptr, base);
    if (errno || (*ret < min) || (*ret > max)) {
        goto error;
    } else if (strptr && *strptr) {
        while (isspace(*strptr)) {
            ++strptr;
        }
        if (*strptr) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    LOGVAL(node->schema->module->ctx, LYE_INVAL, LY_VLOG_LYD, node, val_str ? val_str : "", node->schema->name);
    return EXIT_FAILURE;
}